

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

parson_bool_t is_valid_utf8(char *string,size_t string_len)

{
  JSON_Status JVar1;
  char *string_end;
  size_t sStack_20;
  int len;
  size_t string_len_local;
  char *string_local;
  
  string_end._4_4_ = 0;
  sStack_20 = string_len;
  string_len_local = (size_t)string;
  while( true ) {
    if (string + string_len <= string_len_local) {
      return 1;
    }
    JVar1 = verify_utf8_sequence((uchar *)string_len_local,(int *)((long)&string_end + 4));
    if (JVar1 != 0) break;
    string_len_local = string_len_local + (long)string_end._4_4_;
  }
  return 0;
}

Assistant:

static int is_valid_utf8(const char *string, size_t string_len) {
    int len = 0;
    const char *string_end =  string + string_len;
    while (string < string_end) {
        if (verify_utf8_sequence((const unsigned char*)string, &len) != JSONSuccess) {
            return PARSON_FALSE;
        }
        string += len;
    }
    return PARSON_TRUE;
}